

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O3

void __thiscall discordpp::MessageComponentData::~MessageComponentData(MessageComponentData *this)

{
  _Head_base<0UL,_int_*,_false> _Var1;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  __ptr;
  
  std::
  unique_ptr<std::vector<discordpp::SelectOption,_std::allocator<discordpp::SelectOption>_>,_std::default_delete<std::vector<discordpp::SelectOption,_std::allocator<discordpp::SelectOption>_>_>_>
  ::~unique_ptr(&(this->values).
                 super_field<std::vector<discordpp::SelectOption,_std::allocator<discordpp::SelectOption>_>_>
                 .t_);
  _Var1._M_head_impl =
       (this->component_type).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var1._M_head_impl != (int *)0x0) {
    operator_delete(_Var1._M_head_impl,4);
  }
  (this->component_type).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  __ptr._M_head_impl =
       (this->custom_id).t_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (__ptr._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&this->custom_id,__ptr._M_head_impl);
  }
  (this->custom_id).t_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_>_>
  ::~unique_ptr(&(this->super_ResolvedData).attachments.
                 super_field<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_>
                 .t_);
  std::
  unique_ptr<std::map<discordpp::Snowflake,_discordpp::Message,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Message>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Message,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Message>_>_>_>_>
  ::~unique_ptr(&(this->super_ResolvedData).messages.
                 super_field<std::map<discordpp::Snowflake,_discordpp::Message,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Message>_>_>_>
                 .t_);
  std::
  unique_ptr<std::map<discordpp::Snowflake,_discordpp::Channel,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Channel>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Channel,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Channel>_>_>_>_>
  ::~unique_ptr(&(this->super_ResolvedData).channels.
                 super_field<std::map<discordpp::Snowflake,_discordpp::Channel,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Channel>_>_>_>
                 .t_);
  std::
  unique_ptr<std::map<discordpp::Snowflake,_discordpp::Role,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Role>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Role,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Role>_>_>_>_>
  ::~unique_ptr(&(this->super_ResolvedData).roles.
                 super_field<std::map<discordpp::Snowflake,_discordpp::Role,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Role>_>_>_>
                 .t_);
  std::
  unique_ptr<std::map<discordpp::Snowflake,_discordpp::GuildMember,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::GuildMember>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::GuildMember,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::GuildMember>_>_>_>_>
  ::~unique_ptr(&(this->super_ResolvedData).members.
                 super_field<std::map<discordpp::Snowflake,_discordpp::GuildMember,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::GuildMember>_>_>_>
                 .t_);
  std::
  unique_ptr<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>_>
  ::~unique_ptr(&(this->super_ResolvedData).users.
                 super_field<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>
                 .t_);
  return;
}

Assistant:

MessageComponentData(
        omittable_field<std::map<Snowflake, User> > users = omitted,
        omittable_field<std::map<Snowflake, GuildMember> > members = omitted,
        omittable_field<std::map<Snowflake, Role> > roles = omitted,
        omittable_field<std::map<Snowflake, Channel> > channels = omitted,
        omittable_field<std::map<Snowflake, Message> > messages = omitted,
        omittable_field<std::map<Snowflake, Attachment> > attachments = omitted,
        field<std::string> custom_id = uninitialized,
        field<int> component_type = uninitialized,
        omittable_field<std::vector<SelectOption> > values = omitted
    ):
        ResolvedData(
            users,
            members,
            roles,
            channels,
            messages,
            attachments
        ),
        custom_id(custom_id),
        component_type(component_type),
        values(values)
    {}